

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_env_share_locks(MDB_env *env,int *excl)

{
  int iVar1;
  int *piVar2;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  (env->me_txns->mt1).mtb.mtb_txnid =
       env->me_metas[env->me_metas[0]->mm_txnid < env->me_metas[1]->mm_txnid]->mm_txnid;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 1;
  do {
    iVar1 = fcntl(env->me_lfd,6,&local_48);
    if (iVar1 == 0) {
      iVar1 = 0;
      break;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  } while (iVar1 == 4);
  *excl = -(uint)(iVar1 != 0);
  return iVar1;
}

Assistant:

static int ESECT
mdb_env_share_locks(MDB_env *env, int *excl)
{
	int rc = 0;
	MDB_meta *meta = mdb_env_pick_meta(env);

	env->me_txns->mti_txnid = meta->mm_txnid;

#ifdef _WIN32
	{
		OVERLAPPED ov;
		/* First acquire a shared lock. The Unlock will
		 * then release the existing exclusive lock.
		 */
		memset(&ov, 0, sizeof(ov));
		if (!LockFileEx(env->me_lfd, 0, 0, 1, 0, &ov)) {
			rc = ErrCode();
		} else {
			UnlockFile(env->me_lfd, 0, 0, 1, 0);
			*excl = 0;
		}
	}
#else
	{
		struct flock lock_info;
		/* The shared lock replaces the existing lock */
		memset((void *)&lock_info, 0, sizeof(lock_info));
		lock_info.l_type = F_RDLCK;
		lock_info.l_whence = SEEK_SET;
		lock_info.l_start = 0;
		lock_info.l_len = 1;
		while ((rc = fcntl(env->me_lfd, F_SETLK, &lock_info)) &&
				(rc = ErrCode()) == EINTR) ;
		*excl = rc ? -1 : 0;	/* error may mean we lost the lock */
	}
#endif

	return rc;
}